

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O3

SUNAdaptController SUNAdaptController_H312(SUNContext_conflict sunctx)

{
  undefined8 *puVar1;
  SUNAdaptController p_Var2;
  
  p_Var2 = SUNAdaptController_Soderlind(sunctx);
  puVar1 = (undefined8 *)p_Var2->content;
  *puVar1 = 0x3fc0000000000000;
  puVar1[1] = 0x3fd0000000000000;
  puVar1[2] = 0x3fc0000000000000;
  puVar1[3] = 0xbfd8000000000000;
  puVar1[4] = 0xbfc0000000000000;
  *(undefined4 *)((long)puVar1 + 0x54) = 2;
  return p_Var2;
}

Assistant:

SUNAdaptController SUNAdaptController_H312(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNAdaptController C = SUNAdaptController_Soderlind(sunctx);
  SUNCheckLastErrNull();

  SUNCheckCallNull(
    SUNAdaptController_SetParams_Soderlind(C, SUN_RCONST(1.0) / SUN_RCONST(8.0),
                                           SUN_RCONST(0.25),
                                           SUN_RCONST(1.0) / SUN_RCONST(8.0),
                                           -SUN_RCONST(3.0) / SUN_RCONST(8.0),
                                           -SUN_RCONST(1.0) / SUN_RCONST(8.0)));

  return (C);
}